

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O2

void __thiscall OpenMD::RigidBody::calcForcesAndTorques(RigidBody *this)

{
  pointer ppAVar1;
  Atom *this_00;
  AtomType *this_01;
  bool bVar2;
  uint uVar3;
  int __denom;
  Vector<double,_3U> *trq_00;
  uint uVar4;
  ulong uVar5;
  Vector3d trq;
  Vector3d ef;
  Vector3d pos;
  Vector3d rpos;
  Vector3d afrc;
  Vector3d frc;
  Vector3d apos;
  Vector3d atrq;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  Vector<double,_3U>::Vector(&local_a8);
  Vector<double,_3U>::Vector(&local_60);
  Vector<double,_3U>::Vector(&local_78);
  Vector<double,_3U>::Vector(&local_c0);
  local_f0.data_[0] = 0.0;
  Vector<double,_3U>::Vector(&local_108,local_f0.data_);
  Vector<double,_3U>::Vector(&local_90,&local_108);
  local_d8.data_[0] = 0.0;
  Vector<double,_3U>::Vector(&local_f0,local_d8.data_);
  Vector<double,_3U>::Vector(&local_108,&local_f0);
  local_48.data_[0] = 0.0;
  Vector<double,_3U>::Vector(&local_d8,local_48.data_);
  Vector<double,_3U>::Vector(&local_f0,&local_d8);
  StuntDouble::getPos((Vector3d *)&local_d8,&this->super_StuntDouble);
  uVar3 = DataStorage::getStorageLayout
                    ((DataStorage *)
                     ((long)&(((this->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                             position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                     (this->super_StuntDouble).storage_));
  uVar4 = 0;
  while( true ) {
    uVar5 = (ulong)uVar4;
    ppAVar1 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->atoms_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppAVar1 >> 3) <= uVar5) break;
    this_00 = ppAVar1[uVar5];
    this_01 = this_00->atomType_;
    StuntDouble::getFrc((Vector3d *)&local_48,&this_00->super_StuntDouble);
    Vector<double,_3U>::operator=(&local_a8,&local_48);
    StuntDouble::getPos((Vector3d *)&local_48,
                        &(this->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar5]->super_StuntDouble);
    Vector<double,_3U>::operator=(&local_78,&local_48);
    operator-(&local_48,&local_78,&local_d8);
    Vector3<double>::operator=((Vector3<double> *)&local_c0,&local_48);
    Vector<double,_3U>::add(&local_90,&local_a8);
    local_108.data_[0] =
         (local_a8.data_[2] * local_c0.data_[1] - local_c0.data_[2] * local_a8.data_[1]) +
         local_108.data_[0];
    local_108.data_[1] =
         (local_a8.data_[0] * local_c0.data_[2] - local_c0.data_[0] * local_a8.data_[2]) +
         local_108.data_[1];
    local_108.data_[2] =
         (local_c0.data_[0] * local_a8.data_[1] - local_a8.data_[0] * local_c0.data_[1]) +
         local_108.data_[2];
    bVar2 = Atom::isDirectional((this->atoms_).
                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar5]);
    if (bVar2) {
      StuntDouble::getTrq((Vector3d *)&local_48,
                          &(this->atoms_).
                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar5]->super_StuntDouble);
      Vector<double,_3U>::operator=(&local_60,&local_48);
      Vector<double,_3U>::add(&local_108,&local_60);
    }
    if ((uVar3 >> 0xc & 1) != 0) {
      bVar2 = AtomType::isElectrostatic(this_01);
      if (bVar2) {
        StuntDouble::getElectricField
                  ((Vector3d *)&local_48,
                   &(this->atoms_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5]->super_StuntDouble);
        Vector<double,_3U>::add(&local_f0,&local_48);
      }
    }
    uVar4 = uVar4 + 1;
  }
  StuntDouble::addFrc(&this->super_StuntDouble,(Vector3d *)&local_90);
  trq_00 = &local_108;
  StuntDouble::addTrq(&this->super_StuntDouble,(Vector3d *)trq_00);
  if ((uVar3 >> 0xc & 1) != 0) {
    Vector<double,_3U>::div(&local_f0,(int)trq_00,__denom);
    StuntDouble::setElectricField(&this->super_StuntDouble,(Vector3d *)&local_f0);
  }
  return;
}

Assistant:

void RigidBody::calcForcesAndTorques() {
    Vector3d afrc;
    Vector3d atrq;
    Vector3d apos;
    Vector3d rpos;
    Vector3d frc(0.0);
    Vector3d trq(0.0);
    Vector3d ef(0.0);
    Vector3d pos = this->getPos();
    AtomType* atype;
    int eCount = 0;

    int sl =
        ((snapshotMan_->getCurrentSnapshot())->*storage_).getStorageLayout();

    for (unsigned int i = 0; i < atoms_.size(); i++) {
      atype = atoms_[i]->getAtomType();

      afrc = atoms_[i]->getFrc();
      apos = atoms_[i]->getPos();
      rpos = apos - pos;

      frc += afrc;

      trq[0] += rpos[1] * afrc[2] - rpos[2] * afrc[1];
      trq[1] += rpos[2] * afrc[0] - rpos[0] * afrc[2];
      trq[2] += rpos[0] * afrc[1] - rpos[1] * afrc[0];

      // If the atom has a torque associated with it, then we also need to
      // migrate the torques onto the center of mass:

      if (atoms_[i]->isDirectional()) {
        atrq = atoms_[i]->getTrq();
        trq += atrq;
      }

      if ((sl & DataStorage::dslElectricField) && (atype->isElectrostatic())) {
        ef += atoms_[i]->getElectricField();
        eCount++;
      }
    }
    addFrc(frc);
    addTrq(trq);

    if (sl & DataStorage::dslElectricField) {
      ef /= eCount;
      setElectricField(ef);
    }
  }